

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase229::run(TestCase229 *this)

{
  Builder builder_00;
  Builder builder_01;
  Builder builder_02;
  Builder reader;
  Builder reader_00;
  Reader reader_01;
  Reader reader_02;
  Reader reader_03;
  bool bVar1;
  ulong uVar2;
  undefined7 uVar3;
  char *__n;
  void *__buf;
  int in_R8D;
  initializer_list<int> expected;
  initializer_list<int> expected_00;
  initializer_list<int> expected_01;
  int callCount;
  Builder root;
  EventLoop loop;
  Orphan<capnp::AnyStruct> orphan;
  PipelineOp *local_200;
  Client client;
  Orphan<capnp::AnyList> orphan_1;
  Builder anyStruct;
  Own<capnp::RequestHook> local_190;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_180;
  Maybe<capnp::MessageSize> local_158;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> local_140 [3];
  Own<capnp::ResponseHook> local_110;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyOthers>
            (&root,&builder.super_MessageBuilder);
  capnproto_test::capnp::test::TestAnyOthers::Builder::
  initAnyStructFieldAs<capnproto_test::capnp::test::TestAllTypes>(&local_180,&root);
  builder_00._builder.capTable = local_180._builder.capTable;
  builder_00._builder.segment = local_180._builder.segment;
  builder_00._builder.data = local_180._builder.data;
  builder_00._builder.pointers = local_180._builder.pointers;
  builder_00._builder.dataSize = local_180._builder.dataSize;
  builder_00._builder.pointerCount = local_180._builder.pointerCount;
  builder_00._builder._38_2_ = local_180._builder._38_2_;
  initTestMessage(builder_00);
  capnproto_test::capnp::test::TestAnyOthers::Builder::getAnyStructField(&anyStruct,&root);
  builder_01._builder.pointers._4_4_ = anyStruct._builder.pointers._4_4_;
  builder_01._builder.pointers._0_4_ = anyStruct._builder.pointers._0_4_;
  builder_01._builder.capTable = anyStruct._builder.capTable;
  builder_01._builder.segment = anyStruct._builder.segment;
  builder_01._builder.data = anyStruct._builder.data;
  builder_01._builder.dataSize = anyStruct._builder.dataSize;
  builder_01._builder.pointerCount = anyStruct._builder.pointerCount;
  builder_01._builder._38_2_ = anyStruct._builder._38_2_;
  checkTestMessage(builder_01);
  StructBuilder::asReader(&anyStruct._builder);
  reader_01._reader.capTable._4_4_ = loop._12_4_;
  reader_01._reader.capTable._0_1_ = loop.running;
  reader_01._reader.capTable._1_1_ = loop.lastRunnableState;
  reader_01._reader.capTable._2_2_ = loop._10_2_;
  reader_01._reader.segment = (SegmentReader *)loop.port;
  reader_01._reader.data = loop.head;
  reader_01._reader.pointers = (WirePointer *)loop.tail;
  reader_01._reader._32_8_ = loop.depthFirstInsertPoint;
  reader_01._reader._40_8_ = loop.daemons.disposer;
  checkTestMessage(reader_01);
  bVar1 = capnproto_test::capnp::test::TestAnyOthers::Builder::hasAnyStructField(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    in_R8D = 0x2cb827;
    kj::_::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xef,ERROR,"\"failed: expected \" \"root.hasAnyStructField()\"",
               (char (*) [42])"failed: expected root.hasAnyStructField()");
  }
  capnproto_test::capnp::test::TestAnyOthers::Builder::disownAnyStructField(&orphan,&root);
  OrphanGetImpl<capnp::AnyStruct,_(capnp::Kind)7>::applyReader((Reader *)&loop,&orphan.builder);
  reader_02._reader.capTable._4_4_ = loop._12_4_;
  reader_02._reader.capTable._0_1_ = loop.running;
  reader_02._reader.capTable._1_1_ = loop.lastRunnableState;
  reader_02._reader.capTable._2_2_ = loop._10_2_;
  reader_02._reader.segment = (SegmentReader *)loop.port;
  reader_02._reader.data = loop.head;
  reader_02._reader.pointers = (WirePointer *)loop.tail;
  reader_02._reader._32_8_ = loop.depthFirstInsertPoint;
  reader_02._reader._40_8_ = loop.daemons.disposer;
  checkTestMessage(reader_02);
  bVar1 = capnproto_test::capnp::test::TestAnyOthers::Builder::hasAnyStructField(&root);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    in_R8D = 0x2cb883;
    kj::_::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xf2,ERROR,"\"failed: expected \" \"!(root.hasAnyStructField())\"",
               (char (*) [45])"failed: expected !(root.hasAnyStructField())");
  }
  capnproto_test::capnp::test::TestAnyOthers::Builder::adoptAnyStructField(&root,&orphan);
  bVar1 = capnproto_test::capnp::test::TestAnyOthers::Builder::hasAnyStructField(&root);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    in_R8D = 0x2cb827;
    kj::_::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xf5,ERROR,"\"failed: expected \" \"root.hasAnyStructField()\"",
               (char (*) [42])"failed: expected root.hasAnyStructField()");
  }
  capnproto_test::capnp::test::TestAnyOthers::Builder::getAnyStructField((Builder *)&loop,&root);
  builder_02._builder.capTable._4_4_ = loop._12_4_;
  builder_02._builder.capTable._0_1_ = loop.running;
  builder_02._builder.capTable._1_1_ = loop.lastRunnableState;
  builder_02._builder.capTable._2_2_ = loop._10_2_;
  builder_02._builder.segment = (SegmentBuilder *)loop.port;
  builder_02._builder.data = loop.head;
  builder_02._builder.pointers = (WirePointer *)loop.tail;
  builder_02._builder._32_8_ = loop.depthFirstInsertPoint;
  checkTestMessage(builder_02);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  capnproto_test::capnp::test::TestAnyOthers::Builder::
  initAnyListFieldAs<capnp::List<int,(capnp::Kind)0>>
            ((BuilderFor<capnp::List<int,_(capnp::Kind)0>_> *)&anyStruct,&root,3);
  *(undefined4 *)anyStruct._builder.data = 0x7b;
  *(undefined4 *)((long)anyStruct._builder.data + (ulong)(anyStruct._builder.pointers._4_4_ >> 3)) =
       0x1c8;
  uVar2 = (ulong)(anyStruct._builder.pointers._4_4_ >> 2);
  *(undefined4 *)((long)anyStruct._builder.data + uVar2) = 0x315;
  capnproto_test::capnp::test::TestAnyOthers::Builder::getAnyListField((Builder *)&orphan,&root);
  loop.port = (EventPort *)0x1c80000007b;
  loop.running = true;
  loop.lastRunnableState = true;
  loop._10_2_ = 0;
  reader.builder.segment._4_4_ = orphan.builder.tag.content._4_4_;
  reader.builder.segment._0_4_ = (undefined4)orphan.builder.tag.content;
  reader.builder.capTable = (CapTableBuilder *)orphan.builder.segment;
  reader.builder.ptr = (byte *)orphan.builder.capTable;
  reader.builder._24_8_ = orphan.builder.location;
  reader.builder._32_8_ = local_200;
  expected._M_len = 3;
  expected._M_array = (iterator)&loop;
  checkList<capnp::List<int,_(capnp::Kind)0>::Builder,_capnp::List<int,_(capnp::Kind)0>,_false>
            (reader,expected);
  bVar1 = capnproto_test::capnp::test::TestAnyOthers::Builder::hasAnyListField(&root);
  uVar3 = (undefined7)(uVar2 >> 8);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    uVar3 = 0x2cb8;
    in_R8D = 0x2cb8dd;
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x102,ERROR,"\"failed: expected \" \"root.hasAnyListField()\"",
               (char (*) [40])"failed: expected root.hasAnyListField()");
  }
  capnproto_test::capnp::test::TestAnyOthers::Builder::disownAnyListField(&orphan_1,&root);
  OrphanBuilder::asListReaderAnySize((ListReader *)&loop,&orphan_1.builder);
  client.hook.disposer = (Disposer *)0x1c80000007b;
  client.hook.ptr._0_4_ = 0x315;
  reader_03.reader.capTable._4_4_ = loop._12_4_;
  reader_03.reader.capTable._0_1_ = loop.running;
  reader_03.reader.capTable._1_1_ = loop.lastRunnableState;
  reader_03.reader.capTable._2_2_ = loop._10_2_;
  reader_03.reader.segment = (SegmentReader *)loop.port;
  reader_03.reader.ptr = (byte *)loop.head;
  reader_03.reader._24_8_ = loop.tail;
  reader_03.reader._32_8_ = loop.depthFirstInsertPoint;
  reader_03.reader._40_8_ = loop.daemons.disposer;
  expected_00._M_len = 3;
  expected_00._M_array = (iterator)&client;
  checkList<capnp::List<int,_(capnp::Kind)0>::Reader,_capnp::List<int,_(capnp::Kind)0>_>
            (reader_03,expected_00);
  bVar1 = capnproto_test::capnp::test::TestAnyOthers::Builder::hasAnyListField(&root);
  if (bVar1 && kj::_::Debug::minSeverity < 3) {
    uVar3 = 0x2cb9;
    in_R8D = 0x2cb935;
    kj::_::Debug::log<char_const(&)[43]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x105,ERROR,"\"failed: expected \" \"!(root.hasAnyListField())\"",
               (char (*) [43])"failed: expected !(root.hasAnyListField())");
  }
  capnproto_test::capnp::test::TestAnyOthers::Builder::adoptAnyListField(&root,&orphan_1);
  bVar1 = capnproto_test::capnp::test::TestAnyOthers::Builder::hasAnyListField(&root);
  __n = (char *)CONCAT71(uVar3,2 < kj::_::Debug::minSeverity);
  if (!bVar1 && 2 >= kj::_::Debug::minSeverity) {
    __n = "\"failed: expected \" \"root.hasAnyListField()\"";
    in_R8D = 0x2cb8dd;
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x108,ERROR,"\"failed: expected \" \"root.hasAnyListField()\"",
               (char (*) [40])"failed: expected root.hasAnyListField()");
  }
  capnproto_test::capnp::test::TestAnyOthers::Builder::getAnyListField((Builder *)&loop,&root);
  client.hook.disposer = (Disposer *)0x1c80000007b;
  client.hook.ptr._0_4_ = 0x315;
  reader_00.builder.capTable._4_4_ = loop._12_4_;
  reader_00.builder.capTable._0_1_ = loop.running;
  reader_00.builder.capTable._1_1_ = loop.lastRunnableState;
  reader_00.builder.capTable._2_2_ = loop._10_2_;
  reader_00.builder.segment = (SegmentBuilder *)loop.port;
  reader_00.builder.ptr = (byte *)loop.head;
  reader_00.builder._24_8_ = loop.tail;
  reader_00.builder._32_8_ = loop.depthFirstInsertPoint;
  expected_01._M_len = 3;
  expected_01._M_array = (iterator)&client;
  checkList<capnp::List<int,_(capnp::Kind)0>::Builder,_capnp::List<int,_(capnp::Kind)0>,_false>
            (reader_00,expected_01);
  OrphanBuilder::~OrphanBuilder(&orphan_1.builder);
  kj::EventLoop::EventLoop(&loop);
  orphan_1.builder.segment._0_4_ = 0xffffffff;
  orphan_1.builder.tag.content = (uint64_t)&loop;
  kj::EventLoop::enterScope(&loop);
  callCount = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&orphan,&callCount);
  Capability::Client::Client<capnp::_::TestInterfaceImpl,void>
            ((Client *)&anyStruct,(Own<capnp::_::TestInterfaceImpl> *)&orphan);
  capnproto_test::capnp::test::TestAnyOthers::Builder::setCapabilityField
            (&root,(Client *)&anyStruct);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&anyStruct);
  kj::Own<capnp::_::TestInterfaceImpl>::dispose((Own<capnp::_::TestInterfaceImpl> *)&orphan);
  capnproto_test::capnp::test::TestAnyOthers::Builder::getCapabilityField((Builder *)&client);
  Capability::Client::castAs<capnproto_test::capnp::test::TestInterface>((Client *)&orphan,&client);
  local_158.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)&anyStruct,(Client *)&orphan,&local_158);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&orphan.builder.segment);
  *(undefined4 *)anyStruct._builder.data = 0x7b;
  *(byte *)((long)anyStruct._builder.data + 4) = *(byte *)((long)anyStruct._builder.data + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&orphan,(int)&anyStruct,__buf,(size_t)__n,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            (local_140,&orphan);
  kj::Own<capnp::ResponseHook>::dispose(&local_110);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)&orphan);
  if ((callCount != 1) && (kj::_::Debug::minSeverity < 3)) {
    orphan.builder.tag.content._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x118,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",(int *)&orphan,&callCount);
  }
  kj::Own<capnp::RequestHook>::dispose(&local_190);
  kj::Own<capnp::ClientHook>::dispose(&client.hook);
  kj::WaitScope::~WaitScope((WaitScope *)&orphan_1);
  kj::EventLoop::~EventLoop(&loop);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Any, AnyStructListCapInSchema) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyOthers>();

  {
    initTestMessage(root.initAnyStructFieldAs<TestAllTypes>());
    AnyStruct::Builder anyStruct = root.getAnyStructField();
    checkTestMessage(anyStruct.as<TestAllTypes>());
    checkTestMessage(anyStruct.asReader().as<TestAllTypes>());

    EXPECT_TRUE(root.hasAnyStructField());
    auto orphan = root.disownAnyStructField();
    checkTestMessage(orphan.getReader().as<TestAllTypes>());
    EXPECT_FALSE(root.hasAnyStructField());

    root.adoptAnyStructField(kj::mv(orphan));
    EXPECT_TRUE(root.hasAnyStructField());
    checkTestMessage(root.getAnyStructField().as<TestAllTypes>());
  }

  {
    List<int>::Builder list = root.initAnyListFieldAs<List<int>>(3);
    list.set(0, 123);
    list.set(1, 456);
    list.set(2, 789);

    AnyList::Builder anyList = root.getAnyListField();
    checkList(anyList.as<List<int>>(), {123, 456, 789});

    EXPECT_TRUE(root.hasAnyListField());
    auto orphan = root.disownAnyListField();
    checkList(orphan.getReader().as<List<int>>(), {123, 456, 789});
    EXPECT_FALSE(root.hasAnyListField());

    root.adoptAnyListField(kj::mv(orphan));
    EXPECT_TRUE(root.hasAnyListField());
    checkList(root.getAnyListField().as<List<int>>(), {123, 456, 789});
  }

#if !CAPNP_LITE
  // This portion of the test relies on a Client, not present in lite-mode.
  {
    kj::EventLoop loop;
    kj::WaitScope waitScope(loop);
    int callCount = 0;
    root.setCapabilityField(kj::heap<TestInterfaceImpl>(callCount));
    Capability::Client client = root.getCapabilityField();
    auto req = client.castAs<test::TestInterface>().fooRequest();
    req.setI(123);
    req.setJ(true);
    req.send().wait(waitScope);
    EXPECT_EQ(1, callCount);
  }
#endif
}